

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

void __thiscall
ValueHashTable<Sym_*,_Value_*>::Dump
          (ValueHashTable<Sym_*,_Value_*> *this,_func_void_Sym_ptr *valueDump)

{
  code *pcVar1;
  HashBucket *this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *pTVar4;
  HashBucket *bucket;
  Iterator __iter;
  uint _iterHash;
  _func_void_Sym_ptr *valueDump_local;
  ValueHashTable<Sym_*,_Value_*> *this_local;
  
  Output::Print(
               L"\n-------------------------------------------------------------------------------------------------\n"
               );
  __iter.current._4_4_ = 0;
  do {
    if (this->tableSize <= __iter.current._4_4_) {
      return;
    }
    _bucket = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetIterator
                        (this->table + __iter.current._4_4_);
    while( true ) {
      if (__iter.list ==
          (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_00 = bucket;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *
                         )this_00,node);
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&bucket);
      (*valueDump)(pTVar4->value);
      Output::Print(L"  =>  ",pTVar4->value);
      ::Value::Dump(pTVar4->element);
      Output::Print(L"\n");
    }
    __iter.current._4_4_ = __iter.current._4_4_ + 1;
  } while( true );
}

Assistant:

void Dump(void (*valueDump)(TData))
    {
        Output::Print(_u("\n-------------------------------------------------------------------------------------------------\n"));
        FOREACH_VALUEHASHTABLE_ENTRY(HashBucket, bucket, this)
        {
            valueDump(bucket.value);
            Output::Print(_u("  =>  "), bucket.value);
            bucket.element->Dump();
            Output::Print(_u("\n"));
        }
        NEXT_VALUEHASHTABLE_ENTRY;
    }